

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

idx_t_conflict __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::upper_bound
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *X,idx_t_conflict n,char *P,
          idx_t_conflict P_len)

{
  long lVar1;
  long lVar2;
  char *x;
  unsigned_long *puVar3;
  idx_t_conflict iVar4;
  char *pcVar5;
  long in_RCX;
  idx_t_conflict in_RDX;
  long in_RSI;
  long *in_RDI;
  char *in_R8;
  unsigned_long max_lcp;
  idx_t_conflict lcp_c;
  idx_t_conflict suf_len;
  char *suf;
  idx_t_conflict cutoff;
  idx_t_conflict lcp_r;
  idx_t_conflict lcp_l;
  idx_t_conflict soln;
  idx_t_conflict c;
  int64_t r;
  int64_t l;
  char *min_len;
  unsigned_long local_68;
  char *local_60;
  char *local_58;
  idx_t_conflict local_50;
  idx_t_conflict local_48;
  idx_t_conflict local_40;
  idx_t_conflict local_38;
  char *local_30;
  long local_28;
  long local_18;
  
  local_38 = 0xffffffffffffffff;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = 0x10000;
  local_50 = in_RDX;
  local_40 = in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  while( true ) {
    while( true ) {
      while( true ) {
        if ((long)(local_40 - local_38) < 2) {
          return local_50;
        }
        local_48 = (long)(local_38 + local_40) / 2;
        lVar1 = *in_RDI;
        lVar2 = *(long *)(local_18 + local_48 * 8);
        x = (char *)(in_RDI[1] - *(long *)(local_18 + local_48 * 8));
        std::min<unsigned_long>((unsigned_long *)&local_58,(unsigned_long *)&local_60);
        puVar3 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffff80,&local_68);
        pcVar5 = (char *)*puVar3;
        puVar3 = std::min<unsigned_long>
                           ((unsigned_long *)&stack0xffffffffffffff88,(unsigned_long *)&local_30);
        std::min<unsigned_long>(puVar3,(unsigned_long *)(in_RDI + 7));
        puVar3 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffff78,&local_68);
        min_len = (char *)*puVar3;
        iVar4 = LCP<8ul>(x,pcVar5,(idx_t_conflict)min_len);
        pcVar5 = pcVar5 + iVar4;
        if (pcVar5 == min_len) break;
        if (pcVar5[lVar1 + lVar2] < pcVar5[local_28]) {
          local_38 = local_48;
          local_58 = pcVar5;
        }
        else {
          local_40 = local_48;
          local_50 = local_48;
          local_60 = pcVar5;
        }
      }
      if (pcVar5 == local_30) break;
      local_38 = local_48;
      local_58 = pcVar5;
    }
    if (local_30 == x) break;
    local_40 = local_48;
    local_50 = local_48;
    local_60 = pcVar5;
  }
  return local_48 + 1;
}

Assistant:

T_idx_ Suffix_Array<T_idx_>::upper_bound(const idx_t* const X, const idx_t n, const char* const P, const idx_t P_len) const
{
    // Invariant: SA[l] < P < SA[r].

    int64_t l = -1, r = n;  // (Exclusive-) Range of the iterations in the binary search.
    idx_t c;    // Midpoint in each iteration.
    idx_t soln = n; // Solution of the search.
    idx_t lcp_l = 0, lcp_r = 0; // LCP(P, SA[l]) and LCP(P, SA[r]).
	constexpr idx_t cutoff = 65536; // TODO: better tune and document.

    while(r - l > 1)    // Candidate matches exist.
    {
        c = (l + r) / 2;
        auto const suf = T_ + X[c]; // The suffix at the middle.
        const auto suf_len = n_ - X[c]; // Length of the suffix.

        idx_t lcp_c = std::min(lcp_l, lcp_r);   // LCP(X[c], P).
        lcp_c = std::min(lcp_c, cutoff);
        auto max_lcp = std::min(std::min(suf_len, P_len), max_context); // Maximum possible LCP, i.e. length of the shorter string.
        max_lcp = std::min(max_lcp, cutoff);
        lcp_c += LCP(suf + lcp_c, P + lcp_c, max_lcp - lcp_c);  // Skip an informed number of character comparisons.

        if(lcp_c == max_lcp)    // One is a prefix of the other, or they align at least up-to the context- or the cutoff-length.
        {
            if(lcp_c == P_len)  // P is a prefix of the suffix.
            {
                if(P_len == suf_len)    // The query is the suffix itself, i.e. P = X[c]
                    return c + 1;
                else    // P < X[c]
                    r = c, lcp_r = lcp_c, soln = c;
            }
            else    // The suffix is a prefix of the query, so X[c] < P; technically impossible if the text terminates with $.
                    // Or, their relevant prefixes align; moving to the right, as searching for the upper-bound.
                l = c, lcp_l = lcp_c;
        }
        else    // They mismatch within their relevant prefixes.
            if(suf[lcp_c] < P[lcp_c])   // X[c] < P
                l = c, lcp_l = lcp_c;
            else    // P < X[c]
                r = c, lcp_r = lcp_c, soln = c;
    }


    return soln;
}